

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O3

string * __thiscall
kws::Parser::RemoveComments_abi_cxx11_(string *__return_storage_ptr__,Parser *this,char *buffer)

{
  pointer *pppVar1;
  char *__args;
  pointer ppVar2;
  iterator iVar3;
  byte bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  pointer pcVar8;
  string *psVar9;
  char cVar10;
  size_t sVar11;
  char *pcVar12;
  undefined1 *puVar13;
  undefined1 *puVar14;
  vector<char,_std::allocator<char>_> outBuffer;
  string tempbuf;
  vector<char,_std::allocator<char>_> local_98;
  char *local_78;
  undefined1 *local_70;
  pair<unsigned_long,_unsigned_long> local_68;
  undefined1 local_58 [16];
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  *local_48;
  string *local_40;
  undefined1 *local_38;
  
  if (buffer == (char *)0x0) {
    ppVar2 = (this->m_CommentPositions).
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_CommentPositions).
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != ppVar2) {
      (this->m_CommentPositions).
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppVar2;
    }
    local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (char *)0x0;
    local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (char *)0x0;
    local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (char *)0x0;
    puVar14 = (undefined1 *)(this->m_Buffer)._M_string_length;
    pcVar12 = (this->m_Buffer)._M_dataplus._M_p;
  }
  else {
    local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (char *)0x0;
    local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (char *)0x0;
    local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (char *)0x0;
    local_68.first = (unsigned_long)local_58;
    sVar11 = strlen(buffer);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,buffer,buffer + sVar11);
    puVar14 = (undefined1 *)local_68.second;
    pcVar12 = buffer;
    if ((undefined1 *)local_68.first != local_58) {
      operator_delete((void *)local_68.first);
    }
  }
  local_78 = buffer;
  local_40 = __return_storage_ptr__;
  std::vector<char,_std::allocator<char>_>::reserve(&local_98,(size_type)(puVar14 + 1));
  if (puVar14 != (undefined1 *)0x0) {
    local_38 = puVar14 + -1;
    local_48 = (vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                *)&this->m_CommentPositions;
    puVar13 = (undefined1 *)0x0;
    bVar4 = 0;
    bVar6 = false;
    bVar5 = false;
    local_70 = (undefined1 *)0x0;
    do {
      __args = pcVar12 + (long)puVar13;
      cVar10 = pcVar12[(long)puVar13];
      if ((cVar10 == '\"') &&
         ((puVar13 == (undefined1 *)0x0 || ((pcVar12 + -1)[(long)puVar13] != '\\')))) {
        bVar7 = !bVar5;
        bVar5 = true;
        if (bVar7) goto LAB_001241cc;
LAB_001240bc:
        if (bVar6) {
          if (!(bool)(~bVar4 & 1) && cVar10 == '\n') {
            local_68.first = (unsigned_long)local_70;
            local_68.second = (unsigned_long)puVar13;
            if (local_78 == (char *)0x0) {
              iVar3._M_current =
                   (this->m_CommentPositions).
                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              if (iVar3._M_current ==
                  (this->m_CommentPositions).
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                ::_M_realloc_insert<std::pair<unsigned_long,unsigned_long>const&>
                          (local_48,iVar3,&local_68);
              }
              else {
                (iVar3._M_current)->first = (unsigned_long)local_70;
                (iVar3._M_current)->second = (unsigned_long)puVar13;
                pppVar1 = &(this->m_CommentPositions).
                           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                *pppVar1 = *pppVar1 + 1;
              }
            }
            cVar10 = *__args;
            bVar6 = false;
            bVar4 = 0;
          }
          if ((cVar10 != '/') || ((pcVar12 + -1)[(long)puVar13] != '*')) {
LAB_001241c9:
            bVar5 = false;
            goto LAB_001241cc;
          }
          local_68.second = (unsigned_long)(puVar13 + 1);
          local_68.first = (unsigned_long)local_70;
          if (local_78 == (char *)0x0) {
            iVar3._M_current =
                 (this->m_CommentPositions).
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (iVar3._M_current ==
                (this->m_CommentPositions).
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
              ::_M_realloc_insert<std::pair<unsigned_long,unsigned_long>const&>
                        (local_48,iVar3,&local_68);
            }
            else {
              (iVar3._M_current)->first = (unsigned_long)local_70;
              (iVar3._M_current)->second = local_68.second;
              pppVar1 = &(this->m_CommentPositions).
                         super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *pppVar1 = *pppVar1 + 1;
            }
          }
          bVar6 = false;
          bVar5 = false;
        }
        else {
          bVar5 = false;
          if ((local_38 <= puVar13) || (cVar10 != '/')) goto LAB_001241cc;
          if ((pcVar12 + 1)[(long)puVar13] == '/') {
            bVar4 = 1;
          }
          else if ((pcVar12 + 1)[(long)puVar13] != '*') goto LAB_001241c9;
          bVar5 = false;
          bVar6 = true;
          local_70 = puVar13;
        }
      }
      else {
        bVar7 = !bVar5;
        bVar5 = true;
        if (bVar7) goto LAB_001240bc;
LAB_001241cc:
        if (!bVar6) {
          if (local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                      ((vector<char,std::allocator<char>> *)&local_98,
                       (iterator)
                       local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish,__args);
          }
          else {
            *local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish = *__args;
            local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_finish = local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_finish + 1;
          }
        }
      }
      puVar13 = puVar13 + 1;
    } while (puVar14 != puVar13);
  }
  local_68.first = local_68.first & 0xffffffffffffff00;
  if (local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
              (&local_98,
               (iterator)
               local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish,(char *)&local_68);
  }
  else {
    *local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
     _M_finish = '\0';
    local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  psVar9 = local_40;
  pcVar8 = local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (local_78 == (char *)0x0) {
    pcVar12 = (char *)(this->m_BufferNoComment)._M_string_length;
    strlen(local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start);
    std::__cxx11::string::_M_replace((ulong)&this->m_BufferNoComment,0,pcVar12,(ulong)pcVar8);
    (psVar9->_M_dataplus)._M_p = (pointer)&psVar9->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)psVar9,"");
  }
  else {
    (local_40->_M_dataplus)._M_p = (pointer)&local_40->field_2;
    if (local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start == (char *)0x0) {
      pcVar12 = (char *)0x1;
    }
    else {
      sVar11 = strlen(local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
      pcVar12 = pcVar8 + sVar11;
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)psVar9,pcVar8,pcVar12);
  }
  if (local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (char *)0x0) {
    operator_delete(local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return psVar9;
}

Assistant:

std::string Parser::RemoveComments(const char* buffer)
{
  if(!buffer)
    {
    m_CommentPositions.clear();
    }
  size_t cc;
  const char* inch;
  if(buffer)
    {
    inch = buffer;
    }
  else
    {
    inch = m_Buffer.c_str();
    }

  std::vector<char> outBuffer;
  size_t inStrSize = m_Buffer.size();
  if(buffer)
    {
    std::string tempbuf = buffer;
    inStrSize = tempbuf.size();
    }
  // Reserve enough space for all files. The size will be at least the size of
  // the file.
  outBuffer.reserve(inStrSize+1);

  bool inString  = false;
  bool inComment = false;
  bool copyChar;
  bool cppComment = false;

  size_t beginOfComment = 0;
  size_t endOfComment = 0;

  for ( cc = 0; cc < inStrSize; ++ cc )
    {
    copyChar = true;

    // it is important to know if we are in a string---if we are then
    // we don't care about comment-ish symbols
    //
    // we are starting or ending a string if we find a " without a
    // preceeding '\'
    bool isStringBarrier = (*inch == '"') && (cc == 0 || *(inch-1) != '\\');
    inString = isStringBarrier ? !inString : inString;

    if (!inString)
      {
      if ( !inComment )
        {
        if ( *inch == '/' )
          {
          if ( cc < inStrSize-1 )
            {
            if ( *(inch+1) == '*' )
              {
              inComment = true;
              beginOfComment = cc;
              }
            else if ( *(inch+1) == '/' )
              {
              inComment = true;
              beginOfComment = cc;
              cppComment = true;
              }
            }
          }
        }
      else
        {
        if ( cppComment && *inch == '\n' )
          {
          endOfComment = cc;
          inComment = false;
          copyChar = true;
          cppComment = false;
          PairType pair(beginOfComment, endOfComment);
          if(!buffer)
            {
            m_CommentPositions.push_back(pair);
            }
          }
        if ( *inch == '/' )
          {
          if ( cc != std::string::npos && *(inch-1) == '*' )
            {
            endOfComment = cc+1;
            inComment = false;
            copyChar = false;
            PairType pair(beginOfComment, endOfComment);
            if(!buffer)
              {
              m_CommentPositions.push_back(pair);
              }
            }
          }
        }
      }
    if ( inComment )
      {
      copyChar = false;
      }
    if ( copyChar )
      {
      outBuffer.push_back(*inch);
      }
    inch++;
    }
  outBuffer.push_back(0);
  if(buffer)
    {
    return &*outBuffer.begin();
    }
  else
    {
    m_BufferNoComment = &*outBuffer.begin();
    }

  return "";
}